

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

uint __thiscall Assimp::XFileParser::ReadInt(XFileParser *this)

{
  char *pcVar1;
  char cVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char cVar7;
  allocator<char> local_39;
  string local_38;
  
  if (this->mIsBinaryFormat == true) {
    uVar4 = this->mBinaryNumCount;
    if ((uVar4 == 0) && (uVar4 = 0, 1 < (long)this->mEnd - (long)this->mP)) {
      uVar3 = ReadBinWord(this);
      uVar4 = 1;
      if ((uVar3 == 6) && (3 < (long)this->mEnd - (long)this->mP)) {
        uVar4 = ReadBinDWord(this);
      }
      this->mBinaryNumCount = uVar4;
    }
    this->mBinaryNumCount = uVar4 - 1;
    if (3 < (ulong)((long)this->mEnd - (long)this->mP)) {
      uVar4 = ReadBinDWord(this);
      return uVar4;
    }
    this->mP = this->mEnd;
    uVar5 = 0;
  }
  else {
    FindNextNoneWhiteSpace(this);
    pcVar6 = this->mP;
    cVar2 = *pcVar6;
    cVar7 = cVar2;
    if (cVar2 == '-') {
      this->mP = pcVar6 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      cVar7 = *pcVar1;
    }
    if (9 < (int)cVar7 - 0x30U) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Number expected.",&local_39);
      ThrowException(this,&local_38);
    }
    uVar4 = 0;
    while ((pcVar6 < this->mEnd && ((int)*pcVar6 - 0x30U < 10))) {
      uVar4 = ((int)*pcVar6 - 0x30U) + uVar4 * 10;
      pcVar6 = pcVar6 + 1;
      this->mP = pcVar6;
    }
    CheckForSeparator(this);
    uVar5 = -uVar4;
    if (cVar2 != '-') {
      uVar5 = uVar4;
    }
  }
  return uVar5;
}

Assistant:

unsigned int XFileParser::ReadInt()
{
   if( mIsBinaryFormat)
    {
        if( mBinaryNumCount == 0 && mEnd - mP >= 2)
        {
            unsigned short tmp = ReadBinWord(); // 0x06 or 0x03
            if( tmp == 0x06 && mEnd - mP >= 4) // array of ints follows
                mBinaryNumCount = ReadBinDWord();
            else // single int follows
                mBinaryNumCount = 1;
        }

        --mBinaryNumCount;
        const size_t len( mEnd - mP );
        if ( len >= 4) {
            return ReadBinDWord();
        } else {
            mP = mEnd;
            return 0;
        }
    } else
    {
        FindNextNoneWhiteSpace();

        // TODO: consider using strtol10 instead???

        // check preceding minus sign
        bool isNegative = false;
        if( *mP == '-')
        {
            isNegative = true;
            mP++;
        }

        // at least one digit expected
        if( !isdigit( *mP))
            ThrowException( "Number expected.");

        // read digits
        unsigned int number = 0;
        while( mP < mEnd)
        {
            if( !isdigit( *mP))
                break;
            number = number * 10 + (*mP - 48);
            mP++;
        }

        CheckForSeparator();

        return isNegative ? ((unsigned int) -int( number)) : number;
    }
}